

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multiqueues.h
# Opt level: O3

void __thiscall
Multiqueues<int>::Multiqueues(Multiqueues<int> *this,int numOfThreads,int numOfQueuesPerThread)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint *puVar3;
  id *__s;
  ulong *puVar4;
  ulong *puVar5;
  mutex *__s_00;
  long lVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  
  this->numOfQueues = 2;
  puVar3 = (uint *)operator_new__(4);
  this->seed = puVar3;
  this->threadsMapSize = 0;
  this->numOfThreads = numOfThreads;
  this->numOfQueuesPerThread = numOfQueuesPerThread;
  iVar7 = numOfQueuesPerThread * numOfThreads;
  this->numOfQueues = iVar7;
  sVar8 = (long)numOfThreads * 8;
  if (numOfThreads < 0) {
    sVar8 = 0xffffffffffffffff;
  }
  __s = (id *)operator_new__(sVar8);
  if (numOfThreads != 0) {
    memset(__s,0,(long)numOfThreads * 8);
  }
  uVar10 = (ulong)iVar7;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar10;
  this->threadsMap = __s;
  uVar9 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x30),8) == 0) {
    uVar9 = SUB168(auVar1 * ZEXT816(0x30),0) | 8;
  }
  puVar4 = (ulong *)operator_new__(uVar9);
  *puVar4 = uVar10;
  if (iVar7 != 0) {
    puVar5 = puVar4 + 4;
    lVar6 = uVar10 * 0x30;
    do {
      puVar5[-3] = 0;
      puVar5[-2] = 0;
      puVar5[-1] = 0;
      puVar5[1] = (ulong)puVar5;
      *puVar5 = (ulong)puVar5;
      puVar5[2] = 0;
      puVar5 = puVar5 + 6;
      lVar6 = lVar6 + -0x30;
    } while (lVar6 != 0);
  }
  this->internalQueues = (PriorityQueue *)(puVar4 + 1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar10;
  uVar9 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x28),8) == 0) {
    uVar9 = SUB168(auVar2 * ZEXT816(0x28),0);
  }
  __s_00 = (mutex *)operator_new__(uVar9);
  if (iVar7 != 0) {
    memset(__s_00,0,((uVar10 * 0x28 - 0x28) / 0x28) * 0x28 + 0x28);
  }
  this->locks = __s_00;
  return;
}

Assistant:

Multiqueues(int numOfThreads, int numOfQueuesPerThread) {
        this->numOfThreads = numOfThreads;
        this->numOfQueuesPerThread = numOfQueuesPerThread;
        this->numOfQueues = numOfThreads * numOfQueuesPerThread;
        this->threadsMap = new std::thread::id[numOfThreads];
        internalQueues = new PriorityQueue[numOfQueues];
        locks = new std::mutex[numOfQueues];
    }